

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,Slice *item)

{
  ValueLength *pVVar1;
  ValueLength len;
  ValueLength VVar2;
  Exception *this_00;
  
  checkKeyHasValidType(this,(Slice)item->_start);
  if ((this->options->disallowCustom == true) && (0xef < *item->_start)) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,BuilderCustomDisallowed);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  len = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                  ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)item);
  if (len == 0) {
    VVar2 = this->_pos;
  }
  else {
    reserve(this,len);
    memcpy(this->_start + this->_pos,item->_start,len);
    VVar2 = this->_pos + len;
    this->_pos = VVar2;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + len;
  }
  return this->_start + (VVar2 - len);
}

Assistant:

uint8_t* Builder::set(Slice const& item) {
  checkKeyHasValidType(item);

  if (VELOCYPACK_UNLIKELY(options->disallowCustom && item.isCustom())) {
    // Custom values explicitly disallowed as a security precaution
    throw Exception(Exception::BuilderCustomDisallowed);
  }

  ValueLength const l = item.byteSize();
  if (l != 0) {
    reserve(l);
    VELOCYPACK_ASSERT(item.start() != nullptr);
    std::memcpy(_start + _pos, item.start(), checkOverflow(l));
    advance(l);
  }
  return _start + _pos - l;
}